

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

char * glslang::TQualifier::getLayoutFormatString(TLayoutFormat f)

{
  char *pcStack_10;
  TLayoutFormat f_local;
  
  switch(f) {
  case ElfRgba32f:
    pcStack_10 = "rgba32f";
    break;
  case ElfRgba16f:
    pcStack_10 = "rgba16f";
    break;
  case ElfR32f:
    pcStack_10 = "r32f";
    break;
  case ElfRgba8:
    pcStack_10 = "rgba8";
    break;
  case ElfRgba8Snorm:
    pcStack_10 = "rgba8_snorm";
    break;
  default:
    pcStack_10 = "none";
    break;
  case ElfRg32f:
    pcStack_10 = "rg32f";
    break;
  case ElfRg16f:
    pcStack_10 = "rg16f";
    break;
  case ElfR11fG11fB10f:
    pcStack_10 = "r11f_g11f_b10f";
    break;
  case ElfR16f:
    pcStack_10 = "r16f";
    break;
  case ElfRgba16:
    pcStack_10 = "rgba16";
    break;
  case ElfRgb10A2:
    pcStack_10 = "rgb10_a2";
    break;
  case ElfRg16:
    pcStack_10 = "rg16";
    break;
  case ElfRg8:
    pcStack_10 = "rg8";
    break;
  case ElfR16:
    pcStack_10 = "r16";
    break;
  case ElfR8:
    pcStack_10 = "r8";
    break;
  case ElfRgba16Snorm:
    pcStack_10 = "rgba16_snorm";
    break;
  case ElfRg16Snorm:
    pcStack_10 = "rg16_snorm";
    break;
  case ElfRg8Snorm:
    pcStack_10 = "rg8_snorm";
    break;
  case ElfR16Snorm:
    pcStack_10 = "r16_snorm";
    break;
  case ElfR8Snorm:
    pcStack_10 = "r8_snorm";
    break;
  case ElfRgba32i:
    pcStack_10 = "rgba32i";
    break;
  case ElfRgba16i:
    pcStack_10 = "rgba16i";
    break;
  case ElfRgba8i:
    pcStack_10 = "rgba8i";
    break;
  case ElfR32i:
    pcStack_10 = "r32i";
    break;
  case ElfRg32i:
    pcStack_10 = "rg32i";
    break;
  case ElfRg16i:
    pcStack_10 = "rg16i";
    break;
  case ElfRg8i:
    pcStack_10 = "rg8i";
    break;
  case ElfR16i:
    pcStack_10 = "r16i";
    break;
  case ElfR8i:
    pcStack_10 = "r8i";
    break;
  case ElfR64i:
    pcStack_10 = "r64i";
    break;
  case ElfRgba32ui:
    pcStack_10 = "rgba32ui";
    break;
  case ElfRgba16ui:
    pcStack_10 = "rgba16ui";
    break;
  case ElfRgba8ui:
    pcStack_10 = "rgba8ui";
    break;
  case ElfR32ui:
    pcStack_10 = "r32ui";
    break;
  case ElfRg32ui:
    pcStack_10 = "rg32ui";
    break;
  case ElfRg16ui:
    pcStack_10 = "rg16ui";
    break;
  case ElfRgb10a2ui:
    pcStack_10 = "rgb10_a2ui";
    break;
  case ElfRg8ui:
    pcStack_10 = "rg8ui";
    break;
  case ElfR16ui:
    pcStack_10 = "r16ui";
    break;
  case ElfR8ui:
    pcStack_10 = "r8ui";
    break;
  case ElfR64ui:
    pcStack_10 = "r64ui";
    break;
  case ElfSize1x8:
    pcStack_10 = "size1x8";
    break;
  case ElfSize1x16:
    pcStack_10 = "size1x16";
    break;
  case ElfSize1x32:
    pcStack_10 = "size1x32";
    break;
  case ElfSize2x32:
    pcStack_10 = "size2x32";
    break;
  case ElfSize4x32:
    pcStack_10 = "size4x32";
  }
  return pcStack_10;
}

Assistant:

static const char* getLayoutFormatString(TLayoutFormat f)
    {
        switch (f) {
        case ElfRgba32f:      return "rgba32f";
        case ElfRgba16f:      return "rgba16f";
        case ElfRg32f:        return "rg32f";
        case ElfRg16f:        return "rg16f";
        case ElfR11fG11fB10f: return "r11f_g11f_b10f";
        case ElfR32f:         return "r32f";
        case ElfR16f:         return "r16f";
        case ElfRgba16:       return "rgba16";
        case ElfRgb10A2:      return "rgb10_a2";
        case ElfRgba8:        return "rgba8";
        case ElfRg16:         return "rg16";
        case ElfRg8:          return "rg8";
        case ElfR16:          return "r16";
        case ElfR8:           return "r8";
        case ElfRgba16Snorm:  return "rgba16_snorm";
        case ElfRgba8Snorm:   return "rgba8_snorm";
        case ElfRg16Snorm:    return "rg16_snorm";
        case ElfRg8Snorm:     return "rg8_snorm";
        case ElfR16Snorm:     return "r16_snorm";
        case ElfR8Snorm:      return "r8_snorm";

        case ElfRgba32i:      return "rgba32i";
        case ElfRgba16i:      return "rgba16i";
        case ElfRgba8i:       return "rgba8i";
        case ElfRg32i:        return "rg32i";
        case ElfRg16i:        return "rg16i";
        case ElfRg8i:         return "rg8i";
        case ElfR32i:         return "r32i";
        case ElfR16i:         return "r16i";
        case ElfR8i:          return "r8i";

        case ElfRgba32ui:     return "rgba32ui";
        case ElfRgba16ui:     return "rgba16ui";
        case ElfRgba8ui:      return "rgba8ui";
        case ElfRg32ui:       return "rg32ui";
        case ElfRg16ui:       return "rg16ui";
        case ElfRgb10a2ui:    return "rgb10_a2ui";
        case ElfRg8ui:        return "rg8ui";
        case ElfR32ui:        return "r32ui";
        case ElfR16ui:        return "r16ui";
        case ElfR8ui:         return "r8ui";
        case ElfR64ui:        return "r64ui";
        case ElfR64i:         return "r64i";
        case ElfSize1x8:      return "size1x8";
        case ElfSize1x16:     return "size1x16";
        case ElfSize1x32:     return "size1x32";
        case ElfSize2x32:     return "size2x32";
        case ElfSize4x32:     return "size4x32";
        default:              return "none";
        }
    }